

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_struct(CompilerGLSL *this,SPIRType *type)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  byte local_a2;
  allocator local_a1;
  string local_a0 [32];
  TypedID *local_80;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end1;
  TypedID<(spirv_cross::Types)1> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range1;
  uint32_t local_58;
  bool emitted;
  uint32_t i;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string name;
  TypedID<(spirv_cross::Types)1> local_1c;
  SPIRType *local_18;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  local_18 = type;
  type_local = (SPIRType *)this;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->type_alias);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_1c,0);
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1c);
  local_a2 = 0;
  if (uVar3 != uVar4) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_18->type_alias);
    bVar2 = Compiler::has_extended_decoration
                      (&this->super_Compiler,uVar3,SPIRVCrossDecorationBufferBlockRepacked);
    local_a2 = bVar2 ^ 0xff;
  }
  if ((local_a2 & 1) == 0) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
    add_resource_name(this,uVar3);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_40,this,local_18,0);
    local_48 = "struct ";
    if (((this->backend).explicit_struct_type & 1U) != 0) {
      local_48 = "";
    }
    statement<char_const*,std::__cxx11::string&>(this,&local_48,local_40);
    begin_scope(this);
    ::std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&local_18->member_name_cache);
    local_58 = 0;
    __range1._7_1_ = 0;
    __begin1 = (TypedID<(spirv_cross::Types)1> *)&local_18->member_types;
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
    member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
    for (; __end1 != member; __end1 = __end1 + 1) {
      local_80 = (TypedID *)__end1;
      add_member_name(this,local_18,local_58);
      pSVar1 = local_18;
      uVar4 = TypedID::operator_cast_to_unsigned_int(local_80);
      uVar3 = local_58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"",&local_a1);
      (*(this->super_Compiler)._vptr_Compiler[0x15])
                (this,pSVar1,(ulong)uVar4,(ulong)uVar3,local_a0,0);
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      local_58 = local_58 + 1;
      __range1._7_1_ = 1;
    }
    bVar2 = type_is_empty(this,local_18);
    if ((bVar2) && (((this->backend).supports_empty_struct & 1U) == 0)) {
      statement<char_const(&)[25]>(this,(char (*) [25])"int empty_struct_member;");
      __range1._7_1_ = 1;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
    bVar2 = Compiler::has_extended_decoration
                      (&this->super_Compiler,uVar3,SPIRVCrossDecorationPaddingTarget);
    if (bVar2) {
      (*(this->super_Compiler)._vptr_Compiler[0x16])(this,local_18);
    }
    end_scope_decl(this);
    if ((__range1._7_1_ & 1) != 0) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x5ab0aa);
    }
    ::std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_struct(SPIRType &type)
{
	// Struct types can be stamped out multiple times
	// with just different offsets, matrix layouts, etc ...
	// Type-punning with these types is legal, which complicates things
	// when we are storing struct and array types in an SSBO for example.
	// If the type master is packed however, we can no longer assume that the struct declaration will be redundant.
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
		return;

	add_resource_name(type.self);
	auto name = type_to_glsl(type);

	statement(!backend.explicit_struct_type ? "struct " : "", name);
	begin_scope();

	type.member_name_cache.clear();

	uint32_t i = 0;
	bool emitted = false;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		emit_struct_member(type, member, i);
		i++;
		emitted = true;
	}

	// Don't declare empty structs in GLSL, this is not allowed.
	if (type_is_empty(type) && !backend.supports_empty_struct)
	{
		statement("int empty_struct_member;");
		emitted = true;
	}

	if (has_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget))
		emit_struct_padding_target(type);

	end_scope_decl();

	if (emitted)
		statement("");
}